

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O1

CURLcode dyn_nappend(dynbuf *s,uchar *mem,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  CURLcode CVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  sVar1 = s->leng;
  uVar8 = s->toobig;
  uVar6 = sVar1 + len + 1;
  if (uVar8 < uVar6) {
    (*Curl_cfree)(s->bufr);
    s->bufr = (char *)0x0;
    s->leng = 0;
    s->allc = 0;
    CVar4 = CURLE_TOO_LARGE;
  }
  else {
    uVar2 = s->allc;
    uVar3 = uVar2;
    if (uVar2 == 0) {
      if ((0x1f < uVar8) && (uVar8 = 0x20, 0x20 < uVar6)) {
        uVar8 = uVar6;
      }
    }
    else {
      do {
        uVar7 = uVar3;
        uVar3 = uVar7 * 2;
      } while (uVar7 < uVar6);
      if (uVar7 < uVar8) {
        uVar8 = uVar7;
      }
    }
    if (uVar8 != uVar2) {
      pcVar5 = (char *)(*Curl_crealloc)(s->bufr,uVar8);
      if (pcVar5 == (char *)0x0) {
        (*Curl_cfree)(s->bufr);
        s->bufr = (char *)0x0;
        s->leng = 0;
        s->allc = 0;
        return CURLE_OUT_OF_MEMORY;
      }
      s->bufr = pcVar5;
      s->allc = uVar8;
    }
    if (len != 0) {
      memcpy(s->bufr + sVar1,mem,len);
    }
    s->leng = sVar1 + len;
    s->bufr[sVar1 + len] = '\0';
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode dyn_nappend(struct dynbuf *s,
                            const unsigned char *mem, size_t len)
{
  size_t indx = s->leng;
  size_t a = s->allc;
  size_t fit = len + indx + 1; /* new string + old string + zero byte */

  /* try to detect if there's rubbish in the struct */
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(s->toobig);
  DEBUGASSERT(indx < s->toobig);
  DEBUGASSERT(!s->leng || s->bufr);
  DEBUGASSERT(a <= s->toobig);
  DEBUGASSERT(!len || mem);

  if(fit > s->toobig) {
    Curl_dyn_free(s);
    return CURLE_TOO_LARGE;
  }
  else if(!a) {
    DEBUGASSERT(!indx);
    /* first invoke */
    if(MIN_FIRST_ALLOC > s->toobig)
      a = s->toobig;
    else if(fit < MIN_FIRST_ALLOC)
      a = MIN_FIRST_ALLOC;
    else
      a = fit;
  }
  else {
    while(a < fit)
      a *= 2;
    if(a > s->toobig)
      /* no point in allocating a larger buffer than this is allowed to use */
      a = s->toobig;
  }

  if(a != s->allc) {
    /* this logic is not using Curl_saferealloc() to make the tool not have to
       include that as well when it uses this code */
    void *p = realloc(s->bufr, a);
    if(!p) {
      Curl_dyn_free(s);
      return CURLE_OUT_OF_MEMORY;
    }
    s->bufr = p;
    s->allc = a;
  }

  if(len)
    memcpy(&s->bufr[indx], mem, len);
  s->leng = indx + len;
  s->bufr[s->leng] = 0;
  return CURLE_OK;
}